

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_AABBTree.cpp
# Opt level: O3

bool __thiscall Opcode::AABBTree::Build(AABBTree *this,AABBTreeBuilder *builder)

{
  uint uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  udword *puVar4;
  ulong *puVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  if (builder != (AABBTreeBuilder *)0x0) {
    if (builder->mNbPrimitives == 0) {
      bVar3 = false;
    }
    else {
      Release(this);
      builder->mCount = 1;
      builder->mNbInvalidSplits = 0;
      uVar1 = builder->mNbPrimitives;
      uVar8 = (ulong)uVar1;
      puVar4 = (udword *)operator_new__(uVar8 * 4);
      this->mIndices = puVar4;
      auVar2 = _DAT_001e8190;
      if (uVar8 != 0) {
        lVar6 = uVar8 - 1;
        auVar9._8_4_ = (int)lVar6;
        auVar9._0_8_ = lVar6;
        auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
        uVar7 = 0;
        auVar9 = auVar9 ^ _DAT_001e8190;
        auVar10 = _DAT_001e8180;
        do {
          auVar11 = auVar10 ^ auVar2;
          if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                      auVar9._4_4_ < auVar11._4_4_) & 1)) {
            puVar4[uVar7] = (udword)uVar7;
          }
          if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
              auVar11._12_4_ <= auVar9._12_4_) {
            puVar4[uVar7 + 1] = (udword)uVar7 + 1;
          }
          uVar7 = uVar7 + 2;
          lVar6 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 2;
          auVar10._8_8_ = lVar6 + 2;
        } while ((uVar8 + 1 & 0xfffffffffffffffe) != uVar7);
      }
      (this->super_AABBTreeNode).mNodePrimitives = puVar4;
      (this->super_AABBTreeNode).mNbPrimitives = uVar1;
      if ((builder->mSettings).mLimit == 1) {
        uVar8 = (ulong)(uVar1 * 2 - 1);
        puVar5 = (ulong *)operator_new__(uVar8 * 0x30 + 8);
        *puVar5 = uVar8;
        lVar6 = 0;
        do {
          *(undefined1 (*) [16])((long)puVar5 + lVar6 + 0x20) = (undefined1  [16])0x0;
          *(undefined4 *)((long)puVar5 + lVar6 + 0x30) = 0;
          lVar6 = lVar6 + 0x30;
        } while ((ulong)(uVar1 * 2 - 2) * 0x30 + 0x30 != lVar6);
        this->mPool = (AABBTreeNode *)(puVar5 + 1);
        builder->mNodeBase = (AABBTreeNode *)(puVar5 + 1);
      }
      AABBTreeNode::_BuildHierarchy(&this->super_AABBTreeNode,builder);
      this->mTotalNbNodes = builder->mCount;
      bVar3 = true;
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool AABBTree::Build(AABBTreeBuilder* builder)
{
	// Checkings
	if(!builder || !builder->mNbPrimitives)	return false;

	// Release previous tree
	Release();

	// Init stats
	builder->SetCount(1);
	builder->SetNbInvalidSplits(0);

	// Initialize indices. This list will be modified during build.
	mIndices = new udword[builder->mNbPrimitives];
	CHECKALLOC(mIndices);
	// Identity permutation
	for(udword i=0;i<builder->mNbPrimitives;i++)	mIndices[i] = i;

	// Setup initial node. Here we have a complete permutation of the app's primitives.
	mNodePrimitives	= mIndices;
	mNbPrimitives	= builder->mNbPrimitives;

	// Use a linear array for complete trees (since we can predict the final number of nodes) [Opcode 1.3]
//	if(builder->mRules&SPLIT_COMPLETE)
	if(builder->mSettings.mLimit==1)
	{
		// Allocate a pool of nodes
		mPool = new AABBTreeNode[builder->mNbPrimitives*2 - 1];

		builder->mNodeBase = mPool;	// ### ugly !
	}

	// Build the hierarchy
	_BuildHierarchy(builder);

	// Get back total number of nodes
	mTotalNbNodes	= builder->GetCount();

	// For complete trees, check the correct number of nodes has been created [Opcode 1.3]
	if(mPool)	ASSERT(mTotalNbNodes==builder->mNbPrimitives*2 - 1);

	return true;
}